

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O2

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMP
          (BatchKmersCounter *this,uint8_t K,PairedReadsDatastore *reads,uint64_t gfrom,uint64_t gto
          ,uint64_t batch_size)

{
  byte *pbVar1;
  undefined8 *puVar2;
  byte bVar3;
  uint64_t uVar4;
  KMerNodeFreq_s *pKVar5;
  KmerList *pKVar6;
  KmerList *other;
  __shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  atomic<unsigned_char> *__ptr;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  pointer ppaVar12;
  uint uVar13;
  ulong uVar14;
  ostream *poVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  char *seq;
  ulong uVar17;
  pointer psVar18;
  long lVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ushort uVar20;
  atomic<unsigned_char> **bs;
  uint64_t readID;
  ulong uVar21;
  undefined1 auVar22 [8];
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  size_t new_size;
  ulong uVar28;
  shared_ptr<KmerList> sVar29;
  undefined8 uStack_3a0;
  undefined1 local_398 [8];
  StreamKmerFactory128 skf;
  undefined1 local_140 [8];
  ReadSequenceBuffer bprsg;
  shared_ptr<KmerList> *kmer_list;
  undefined1 auStack_d8 [8];
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> read_kmers;
  atomic_uint_fast8_t (*__range1) [2959718];
  undefined1 auStack_98 [8];
  vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_> batch_status;
  undefined1 auStack_68 [8];
  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  batch_lists;
  undefined1 local_48 [8];
  shared_ptr<KmerList> local_kmer_list;
  
  uVar24 = gto - gfrom;
  uVar26 = (uVar24 >> 2) + 1;
  if (batch_size != 0) {
    uVar26 = batch_size;
  }
  uVar20 = 0;
  uStack_3a0 = 0x20e480;
  poVar15 = sdglib::OutputLog(INFO,true);
  uStack_3a0 = 0x20e48f;
  poVar15 = std::operator<<(poVar15,"OMP-merge kmer counting in ");
  uStack_3a0 = 0x20e49a;
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  uStack_3a0 = 0x20e4a9;
  poVar15 = std::operator<<(poVar15," batches of ");
  uStack_3a0 = 0x20e4bb;
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  uStack_3a0 = 0x20e4ca;
  poVar15 = std::operator<<(poVar15," reads");
  uStack_3a0 = 0x20e4d2;
  std::endl<char,std::char_traits<char>>(poVar15);
  auStack_98 = (undefined1  [8])0x0;
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  batch_lists.
  super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  batch_lists.
  super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uVar14 = ((uVar24 + uVar26) - 1) / uVar26;
  for (uVar27 = uVar14; 1 < uVar27; uVar27 = uVar27 + 1 >> 1) {
    uStack_3a0 = 0x20e511;
    local_398 = (undefined1  [8])calloc(1,uVar27);
    uStack_3a0 = 0x20e527;
    std::vector<std::atomic<unsigned_char>*,std::allocator<std::atomic<unsigned_char>*>>::
    emplace_back<std::atomic<unsigned_char>*>
              ((vector<std::atomic<unsigned_char>*,std::allocator<std::atomic<unsigned_char>*>> *)
               auStack_98,(atomic<unsigned_char> **)local_398);
    uStack_3a0 = 0x20e52f;
    std::
    vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
    ::emplace_back<>((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                      *)auStack_68);
    uStack_3a0 = 0x20e53f;
    std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::resize
              (batch_lists.
               super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -1,uVar27);
    uVar20 = uVar20 + 1;
  }
  uStack_3a0 = 0x20e553;
  poVar15 = sdglib::OutputLog(INFO,true);
  uStack_3a0 = 0x20e562;
  poVar15 = std::operator<<(poVar15,"Created ");
  local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar20;
  uStack_3a0 = 0x20e571;
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,uVar20);
  uStack_3a0 = 0x20e580;
  poVar15 = std::operator<<(poVar15," levels");
  uStack_3a0 = 0x20e588;
  std::endl<char,std::char_traits<char>>(poVar15);
  lVar10 = -(ulong)((int)local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 0xfU & 0xfffffff0);
  lVar19 = (long)&skf + lVar10 + -8;
  for (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      p_Var16; p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&p_Var16->_vptr__Sp_counted_base + 1)) {
    LOCK();
    *(undefined1 *)(lVar19 + (long)p_Var16) = 0;
    UNLOCK();
  }
  *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e5e6;
  ReadSequenceBuffer::ReadSequenceBuffer((ReadSequenceBuffer *)local_140,reads,100000,1000);
  auStack_d8 = (undefined1  [8])0x0;
  read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (ulong)((int)local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi - 1);
  uVar27 = 0;
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)K;
  *(undefined8 *)((long)&uStack_3a0 + lVar10) = 10;
  uVar8 = *(undefined8 *)((long)&uStack_3a0 + lVar10);
  lVar25 = 0;
  do {
    if (uVar14 <= uVar27) {
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e8b7;
      std::_Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>::~_Vector_base
                ((_Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_> *)auStack_d8);
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e8c3;
      ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)local_140);
      psVar18 = batch_lists.
                super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].
                super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pKVar6 = (psVar18->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      other = psVar18[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e8d7;
      KmerList::merge(pKVar6,other);
      p_Var7 = &(batch_lists.
                 super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e8ee;
      std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var7);
      p_Var7 = &(batch_lists.
                 super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e8fb;
      std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset(p_Var7);
      psVar18 = batch_lists.
                super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].
                super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e90c;
      std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset
                (&psVar18[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>);
      ppaVar12 = batch_status.
                 super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      for (auVar22 = auStack_98; auVar22 != (undefined1  [8])ppaVar12;
          auVar22 = (undefined1  [8])((long)auVar22 + 8)) {
        __ptr = *(atomic<unsigned_char> **)auVar22;
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e927;
        free(__ptr);
      }
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 1;
      uVar8 = *(undefined8 *)((long)&uStack_3a0 + lVar10);
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e937;
      poVar15 = sdglib::OutputLog(INFO,SUB81(uVar8,0));
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e946;
      poVar15 = std::operator<<(poVar15,"Total kmers processed ");
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e951;
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e959;
      std::endl<char,std::char_traits<char>>(poVar15);
      uStack_3a0 = 0x20e969;
      std::
      vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
      ::~vector((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                 *)auStack_68);
      uStack_3a0 = 0x20e975;
      std::_Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
      ::~_Vector_base((_Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                       *)auStack_98);
      sVar29.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar29.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<KmerList>)sVar29.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
    }
    uVar17 = uVar24 - (uVar14 - 1) * uVar26;
    if (uVar27 < uVar14 - 1) {
      uVar17 = uVar26;
    }
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e651;
    std::make_shared<KmerList>();
    auVar22 = local_48;
    readID = uVar26 * uVar27 + gfrom;
    uVar28 = readID + uVar17;
    uVar4 = reads->readsize;
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e67f;
    KmerList::resize((KmerList *)auVar22,(uVar17 + 1) * uVar4);
    uVar13 = batch_status.
             super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e68e;
    KMerFactory128::KMerFactory128((KMerFactory128 *)local_398,(uint8_t)uVar13);
    new_size = 0;
    while (auVar22 = local_48, readID = readID + 1, readID <= uVar28) {
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e6a8;
      seq = ReadSequenceBuffer::get_read_sequence((ReadSequenceBuffer *)local_140,readID);
      *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e6be;
      StreamKmerFactory128::produce_all_kmers
                ((StreamKmerFactory128 *)local_398,seq,
                 (vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)auStack_d8);
      lVar23 = new_size * 0x11 + 0x10;
      for (auVar22 = auStack_d8;
          auVar22 !=
          (undefined1  [8])
          read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
          _M_impl.super__Vector_impl_data._M_start;
          auVar22 = (undefined1  [8])((long)auVar22 + 0x10)) {
        uVar9 = *(undefined8 *)((long)auVar22 + 8);
        pKVar5 = *(KMerNodeFreq_s **)local_48;
        puVar2 = (undefined8 *)((long)pKVar5 + lVar23 + -0x10);
        *puVar2 = (long)*(unsigned___int128 *)auVar22;
        puVar2[1] = uVar9;
        *(undefined1 *)((long)&pKVar5->kdata + lVar23) = 1;
        new_size = new_size + 1;
        lVar23 = lVar23 + 0x11;
      }
      if ((undefined1  [8])
          read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
          _M_impl.super__Vector_impl_data._M_start != auStack_d8) {
        read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)auStack_d8;
      }
    }
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e718;
    KmerList::resize((KmerList *)auVar22,new_size);
    auVar22 = local_48;
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e721;
    KmerList::sort((KmerList *)auVar22);
    auVar22 = local_48;
    bprsg._56_8_ = lVar25 + new_size;
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e734;
    KmerList::uniq((KmerList *)auVar22);
    uVar17 = 0;
    while( true ) {
      uVar17 = uVar17 & 0xffff;
      LOCK();
      pbVar1 = (byte *)(lVar19 + uVar17);
      bVar3 = *pbVar1;
      *pbVar1 = *pbVar1 + 1;
      UNLOCK();
      uVar28 = (ulong)bVar3;
      iVar11 = (int)uVar17;
      if (((long)(((pointer)((long)auStack_68 + uVar17 * 0x18))->
                 super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(((pointer)((long)auStack_68 + uVar17 * 0x18))->
                 super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U == uVar28) {
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 1;
        uVar9 = *(undefined8 *)((long)&uStack_3a0 + lVar10);
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e774;
        poVar15 = sdglib::OutputLog(INFO,SUB81(uVar9,0));
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e783;
        poVar15 = std::operator<<(poVar15,"level ");
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e78f;
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar11 + 1);
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e79e;
        poVar15 = std::operator<<(poVar15," done.");
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e7a6;
        std::endl<char,std::char_traits<char>>(poVar15);
      }
      if ((int)local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi <= iVar11) break;
      if ((bVar3 & 1) == 0) {
        psVar18 = (((pointer)((long)auStack_68 + uVar17 * 0x18))->
                  super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (((long)(((pointer)((long)auStack_68 + uVar17 * 0x18))->
                   super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar18 >> 4) - 1U != uVar28)
        goto LAB_0020e85a;
      }
      else {
        uVar21 = (ulong)(bVar3 - 1);
        while (auVar22 = local_48,
              (*(pointer)((long)auStack_98 + uVar17 * 8))[uVar21].super___atomic_base<unsigned_char>
              ._M_i != '\x01') {
          *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e7f5;
          usleep((__useconds_t)uVar8);
        }
        LOCK();
        *(undefined1 *)(*(long *)((long)auStack_98 + (ulong)(uint)(iVar11 * 8)) + uVar21) = 2;
        UNLOCK();
        LOCK();
        *(undefined1 *)(*(long *)((long)auStack_98 + (ulong)(uint)(iVar11 * 8)) + uVar28) = 2;
        UNLOCK();
        pKVar6 = (((pointer)((long)auStack_68 + uVar17 * 0x18))->
                 super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar21].
                 super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e839;
        KmerList::merge((KmerList *)auVar22,pKVar6);
        psVar18 = (((pointer)((long)auStack_68 + uVar17 * 0x18))->
                  super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e849;
        std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&psVar18[uVar21].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>);
      }
      uVar17 = (ulong)(iVar11 + 1);
    }
    psVar18 = (((pointer)((long)auStack_68 + uVar17 * 0x18))->
              super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
LAB_0020e85a:
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e86f;
    std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar18[bVar3].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e877;
    std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    LOCK();
    (*(pointer)((long)auStack_98 + uVar17 * 8))[uVar28].super___atomic_base<unsigned_char>._M_i =
         '\x01';
    UNLOCK();
    *(undefined8 *)((long)&uStack_3a0 + lVar10) = 0x20e891;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_kmer_list);
    uVar27 = uVar27 + 1;
    lVar25 = bprsg._56_8_;
  } while( true );
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMP(uint8_t K, PairedReadsDatastore const &reads, uint64_t gfrom, uint64_t gto, uint64_t batch_size) {
    uint64_t totalKmers(0);
    //Compute how many "batches" will be used. and malloc a structure for them and a bool array to mark them "ready to process".
    //optionally, there could be a total count of "ready kmers" to set a limit for memory usage, if total count is too high, slaves would wait
    if (batch_size == 0) batch_size = (gto - gfrom) / (4 * omp_get_max_threads()) + 1;
    const uint64_t batches = ((gto - gfrom) + batch_size - 1) / batch_size;
    sdglib::OutputLog() << "OMP-merge kmer counting in " << batches << " batches of " << batch_size << " reads" << std::endl;

    std::vector<std::atomic_uint_fast8_t *> batch_status; //level->batch->status

    std::vector<std::vector<std::shared_ptr<KmerList>>> batch_lists; //level->batch-> pointer to batch
    uint16_t levels = 0;
    for (auto elements = batches; elements > 1; elements = (elements + 1) / 2) {
        batch_status.push_back((std::atomic_uint_fast8_t *) calloc(sizeof(std::atomic_uint_fast8_t), elements));
        batch_lists.emplace_back();
        batch_lists.back().resize(elements);
//        sdglib::OutputLog() << "level " << levels << " created with " << elements << " elements " << std::endl;
        ++levels;
    }
    sdglib::OutputLog() << "Created " << levels << " levels" << std::endl;
    std::atomic_uint_fast8_t level_count[levels]; //level->count
    for (auto &l:level_count)l = 0;

#pragma omp parallel shared(reads) reduction(+:totalKmers)
    {
        ReadSequenceBuffer bprsg(reads,100000,1000);
        std::vector<__uint128_t> read_kmers;
#pragma omp for schedule(dynamic)
        for (auto batch = 0; batch < batches; ++batch) {
            //==== Part 1: actually counting ====
            uint64_t from = gfrom + batch * batch_size;
            uint64_t read_count = (batch < batches - 1) ? batch_size : (gto - gfrom) - batch_size * (batches - 1);
            uint64_t to = from + read_count;

            std::shared_ptr<KmerList> local_kmer_list = std::make_shared<KmerList>();
            uint64_t total_good_length = reads.readsize*(to-from+1);
            local_kmer_list->resize(total_good_length);
            //Populate the kmer list
            uint64_t last_kmer=0;

            // Replace with generating all the kmers from the reads!
            StreamKmerFactory128 skf(K);

            for (uint64_t rid=from+1; rid<= to; ++rid) {
                skf.produce_all_kmers(bprsg.get_read_sequence(rid), read_kmers);
                for (const auto &rk: read_kmers){
                    local_kmer_list->kmers[last_kmer].kdata=rk;
                    local_kmer_list->kmers[last_kmer].count=1;
                    ++last_kmer;
                }
                read_kmers.clear();
            }

            totalKmers += last_kmer;
            //std::cout<<last_kmer<<" kmers inserted in a batch"<<std::endl;
            local_kmer_list->resize(last_kmer);
            local_kmer_list->sort();
            local_kmer_list->uniq();
            //std::cout<<local_kmer_list->size<<" unique kmers in a batch"<<std::endl;
            //std::sort(local_kmer_list->begin(), local_kmer_list->end());
            //collapse_entries(*local_kmer_list);

            //==== Part 2: merging till no results of same level available ====
            //merge_level=0
            uint16_t merge_level = 0;
            bool just_merged = true;
            //while (just merged)
            while (just_merged) {
                //   insert the list into this merge level's queue
                uint16_t slot = level_count[merge_level]++;
                if (slot == batch_lists[merge_level].size() - 1) {
#pragma omp critical
                    sdglib::OutputLog() << "level " << (merge_level+1) << " done." << std::endl;
                }
                //   if insertion number is odd or last batch:
                if (merge_level < levels - 1 and (slot % 2 == 1 or slot == batch_lists[merge_level].size() - 1)) {
                    // mix with the previous even number (using own list as base, this way we preserve locality)
                    if (slot % 2 == 1) {
                        while (batch_status[merge_level][slot - 1] != 1)
                            usleep(10); //wait for the previous batch to be finished.
                        batch_status[merge_level][slot - 1] = 2;
                        batch_status[merge_level][slot] = 2;
                        //inplace_count_merge(local_kmer_list, batch_lists[merge_level][slot - 1]);
                        local_kmer_list->merge(*batch_lists[merge_level][slot - 1]);
                        batch_lists[merge_level][slot - 1].reset();
                    }
                    //      increase level
                    ++merge_level;
                    just_merged = true;
                } else {
                    // no batch available for merging, next thread at this level will pick up
                    batch_lists[merge_level][slot] = local_kmer_list;
                    local_kmer_list.reset();
                    batch_status[merge_level][slot] = 1;
                    just_merged = false;
                }
                //IDEA: fixed partitioning can be used to keep 2*thread-number lists for longer.
            }
        }

    }


//    sdglib::OutputLog() << "Top level merge starting" << std::endl;
    //inplace_count_merge(batch_lists.back()[0], batch_lists.back()[1]);
    batch_lists.back()[0]->merge(*batch_lists.back()[1]);
//    sdglib::OutputLog() << "Top level merge done" << std::endl;
    std::shared_ptr<KmerList> kmer_list = batch_lists.back()[0];
    batch_lists.back()[0].reset();
    batch_lists.back()[1].reset();
    for (auto &bs:batch_status) free(bs);
//    sdglib::OutputLog() << "cleanup done" << std::endl;
    sdglib::OutputLog() << "Total kmers processed " << totalKmers << std::endl;
    return kmer_list;
}